

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(NodeRecordMB4D *__return_storage_ptr__,
         BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
         *this,BuildRecord *current,CachedAllocator alloc,bool toplevel)

{
  SetMB *set;
  size_t *psVar1;
  range<unsigned_long> *prVar2;
  atomic<unsigned_long> *paVar3;
  char *pcVar4;
  float fVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  PrimRefVector pmVar8;
  PrimRefVector pmVar9;
  PrimRefMB *pPVar10;
  MemoryMonitorInterface *pMVar11;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar12;
  PrimRefVector pmVar13;
  ThreadLocal2 *pTVar14;
  Split *pSVar15;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *pPVar16;
  vint *pvVar17;
  code *pcVar18;
  unsigned_long end_00;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar26;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar27;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar28;
  char cVar29;
  size_t i_1;
  long *plVar30;
  MutexSys *this_00;
  size_t sVar31;
  BBox1f BVar32;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var33;
  void *pvVar34;
  runtime_error *prVar35;
  byte bVar36;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar38;
  float *pfVar39;
  unsigned_long *puVar40;
  unsigned_long uVar41;
  size_t end;
  SetMB *set_00;
  undefined1 *puVar42;
  char *pcVar43;
  ulong size;
  ulong uVar44;
  BBox1f *pBVar45;
  size_t sVar46;
  size_t sVar47;
  size_t begin;
  long lVar48;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  _Var49;
  BBox1f BVar50;
  BuildRecord *current_00;
  size_t i_4;
  BBox1f BVar51;
  bool bVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  task_group_context *in_stack_ffffffffffffe598;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1a48 [16];
  undefined1 local_1a38 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector_1;
  undefined1 local_1a08 [16];
  BBox1f time_range1_1;
  BBox1f time_range0_1;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_19d8;
  __uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  local_19d0;
  PrimRefVector lprims_1;
  PrimRefVector lprims;
  undefined8 local_19b8;
  undefined1 local_19b0 [16];
  undefined1 auStack_19a0 [8];
  vbool vSplitMask;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1968 [7];
  ulong local_18f0;
  anon_class_24_3_c5d13451 isLeft;
  undefined8 uStack_18d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888 [3];
  BBox1f local_1850;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1848;
  BBox1f time_range1;
  anon_class_1_0_00000001 reduction2_1;
  undefined1 local_17f8 [16];
  anon_class_1_0_00000001 reduction;
  unsigned_long local_1788;
  unsigned_long uStack_1780;
  vint vSplitPos;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1748;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1738;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1728 [4];
  size_t local_16e8;
  size_t local_16e0;
  BBox1f local_16c0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_16b8;
  anon_class_1_0_00000001 reduction2;
  unsigned_long local_1648;
  unsigned_long local_1640;
  BBox1f time_range0;
  anon_union_4_2_620955e9_for_BinSplit<32UL>_3 local_1610;
  uint uStack_160c;
  size_t sStack_1608;
  vint vSplitPos_1;
  Split csplit;
  SetMB local_1508;
  SetMB local_1468;
  LocalChildList_conflict children;
  NodeRecordMB4D values [16];
  
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAlloc).super_Create.allocator;
    plVar30 = (long *)__tls_get_addr(&PTR_021f8d38);
    this_00 = (MutexSys *)*plVar30;
    if (this_00 == (MutexSys *)0x0) {
      this_00 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_00);
      this_00[1].mutex = (void *)0x0;
      this_00[8].mutex = this_00;
      auVar54 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00 + 9) = ZEXT1632(auVar54);
      *(undefined1 (*) [32])(this_00 + 0xb) = ZEXT1632(auVar54);
      this_00[0x10].mutex = this_00;
      *(undefined1 (*) [32])(this_00 + 0x11) = ZEXT1632(auVar54);
      *(undefined1 (*) [32])(this_00 + 0x13) = ZEXT1632(auVar54);
      *plVar30 = (long)this_00;
      children.children.items[0].depth = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0]._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      values[0].ref.ptr = (size_t)this_00;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)values);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)values);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
    }
    alloc.talloc0 = (ThreadLocal *)(this_00 + 8);
    alloc.talloc1 = (ThreadLocal *)(this_00 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     (sVar46 = (current->prims).super_PrimInfoMB.object_range._end -
               (current->prims).super_PrimInfoMB.object_range._begin,
     sVar46 <= (this->cfg).singleThreadThreshold)) {
    Scene::BuildProgressMonitorInterface::operator()(&this->progressMonitor,sVar46);
  }
  set = &current->prims;
  find(&csplit,this,set);
  bVar36 = (byte)(this->cfg).logBlockSize;
  sVar46 = (current->prims).super_PrimInfoMB.object_range._end;
  sVar47 = (current->prims).super_PrimInfoMB.object_range._begin;
  uVar44 = sVar46 - sVar47;
  if ((uVar44 <= (this->cfg).minLeafSize) || ((this->cfg).maxDepth <= current->depth + 8)) {
LAB_00ccaade:
    SetMB::deterministic_order(set);
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,current,alloc_00);
    return __return_storage_ptr__;
  }
  fVar53 = (current->prims).super_PrimInfoMB.time_range.upper;
  fVar5 = (current->prims).super_PrimInfoMB.time_range.lower;
  if (uVar44 <= (this->cfg).maxLeafSize) {
    auVar63 = vsubps_avx((undefined1  [16])
                         (current->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                         field_0,(undefined1  [16])
                                 (current->prims).super_PrimInfoMB.
                                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                                 lower.field_0);
    auVar22 = vsubps_avx((undefined1  [16])
                         (current->prims).super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                         field_0,(undefined1  [16])
                                 (current->prims).super_PrimInfoMB.
                                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                                 lower.field_0);
    auVar54 = vmovshdup_avx(auVar63);
    auVar20 = vshufpd_avx(auVar63,auVar63,1);
    auVar64 = vmovshdup_avx(auVar22);
    auVar21 = vshufpd_avx(auVar22,auVar22,1);
    fVar19 = (fVar53 - fVar5) *
             ((auVar54._0_4_ + auVar20._0_4_) * auVar63._0_4_ + auVar54._0_4_ * auVar20._0_4_ +
             (auVar21._0_4_ + auVar64._0_4_) * auVar22._0_4_ + auVar21._0_4_ * auVar64._0_4_) * 0.5;
    fVar76 = (this->cfg).intCost;
    if (fVar76 * fVar19 * (float)(~(-1L << (bVar36 & 0x3f)) +
                                  (current->prims).super_PrimInfoMB.num_time_segments >>
                                 (bVar36 & 0x3f)) <=
        fVar19 * (this->cfg).travCost + fVar76 * csplit.sah) goto LAB_00ccaade;
  }
  switch(csplit.data) {
  case 0:
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_4_ = 0x7f800000;
    children.children.items[0]._12_4_ = 0x7f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    auVar70._8_4_ = 0x3f800000;
    auVar70._0_8_ = 0x3f8000003f800000;
    auVar70._12_4_ = 0x3f800000;
    uVar6 = vmovlps_avx(auVar70);
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0;
    values[0].ref.ptr = 0x7f8000007f800000;
    values[0]._8_4_ = 0x7f800000;
    values[0]._12_4_ = 0x7f800000;
    values[0].lbounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds0.upper.field_0.m128[3] = INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    values[0].lbounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[0] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[1] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[2] = INFINITY;
    values[0].lbounds.bounds1.upper.field_0.m128[3] = INFINITY;
    values[0].dt.lower = -INFINITY;
    values[0].dt.upper = -INFINITY;
    values[0]._88_4_ = 0xff800000;
    values[0]._92_4_ = 0xff800000;
    values[1].ref.ptr = 0;
    values[1]._8_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._0_8_ = 0;
    values[1].lbounds.bounds0.lower.field_0._8_8_ = 0;
    values[1].lbounds.bounds0.upper.field_0.m128[0] = 0.0;
    values[1].lbounds.bounds0.upper.field_0._4_8_ = vmovlps_avx(auVar70);
    values[1].lbounds.bounds0.upper.field_0.m128[3] = 0.0;
    auVar20._4_4_ = csplit.data;
    auVar20._0_4_ = csplit.field_2.pos;
    auVar20._8_8_ = csplit.mapping.num;
    vSplitPos.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar20,0);
    isLeft.vSplitPos = &vSplitPos;
    lVar48 = (long)(1 << ((byte)csplit.dim & 0x1f)) * 0x10;
    vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar48);
    vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar48 + 8);
    isLeft.vSplitMask = &vSplitMask;
    isLeft.split = &csplit;
    sVar31 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                       (((current->prims).prims)->items,sVar47,sVar46,(EmptyTy *)&vSplitPos_1,
                        (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
                        (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,&isLeft,&reduction,
                        &reduction2,0x80,0xc00);
    pmVar8 = (current->prims).prims;
    local_1a08._8_8_ = 0;
    local_1a08._0_4_ = (current->prims).super_PrimInfoMB.time_range.lower;
    local_1a08._4_4_ = (current->prims).super_PrimInfoMB.time_range.upper;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&local_1468.super_PrimInfoMB,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children
              );
    auVar55._8_8_ = 0;
    auVar55._0_4_ = local_1468.super_PrimInfoMB.time_range.lower;
    auVar55._4_4_ = local_1468.super_PrimInfoMB.time_range.upper;
    auVar54 = vcmpps_avx(auVar55,local_1a08,1);
    auVar64 = vinsertps_avx(local_1a08,auVar55,0x50);
    auVar20 = vinsertps_avx(auVar55,local_1a08,0x50);
    auVar54 = vblendvps_avx(auVar20,auVar64,auVar54);
    local_1468.super_PrimInfoMB.time_range = (BBox1f)vmovlps_avx(auVar54);
    pmVar9 = (current->prims).prims;
    local_1a08._8_8_ = 0;
    local_1a08._0_4_ = (current->prims).super_PrimInfoMB.time_range.lower;
    local_1a08._4_4_ = (current->prims).super_PrimInfoMB.time_range.upper;
    local_1468.super_PrimInfoMB.object_range._begin = sVar47;
    local_1468.super_PrimInfoMB.object_range._end = sVar31;
    local_1468.prims = pmVar8;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&local_1508.super_PrimInfoMB,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values);
    auVar56._8_8_ = 0;
    auVar56._0_4_ = local_1508.super_PrimInfoMB.time_range.lower;
    auVar56._4_4_ = local_1508.super_PrimInfoMB.time_range.upper;
    auVar54 = vcmpps_avx(auVar56,local_1a08,1);
    auVar64 = vinsertps_avx(local_1a08,auVar56,0x50);
    auVar20 = vinsertps_avx(auVar56,local_1a08,0x50);
    auVar54 = vblendvps_avx(auVar20,auVar64,auVar54);
    local_1508.super_PrimInfoMB.time_range = (BBox1f)vmovlps_avx(auVar54);
    local_1508.super_PrimInfoMB.object_range._begin = sVar31;
    local_1508.super_PrimInfoMB.object_range._end = sVar46;
    local_1508.prims = pmVar9;
    break;
  case 1:
    SetMB::deterministic_order(set);
    splitFallback(this,set,&local_1468,&local_1508);
    break;
  case 2:
    time_range0.upper = csplit.field_2.fpos;
    time_range1.upper = fVar53;
    time_range1.lower = csplit.field_2.fpos;
    BVar32 = (BBox1f)(current->prims).prims;
    time_range0.lower = fVar5;
    _Var33.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )::operator_new(0x28);
    pMVar11 = (this->heuristicTemporalSplit).device;
    *(MemoryMonitorInterface **)
     _Var33.
     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
     .
     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
     ._M_head_impl = pMVar11;
    *(undefined1 *)
     ((long)_Var33.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl + 8) = 0;
    size = uVar44 * 0x50;
    *(long *)((long)_Var33.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x10) = 0;
    *(long *)((long)_Var33.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x18) = 0;
    *(long *)((long)_Var33.
                    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                    .
                    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                    ._M_head_impl + 0x20) = 0;
    (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,size,0);
    if (size < 0x1c00000) {
      pvVar34 = alignedMalloc(size,0x10);
    }
    else {
      pvVar34 = os_malloc(size,(bool *)((long)_Var33.
                                              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                              .
                                              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                              ._M_head_impl + 8));
    }
    local_1988._0_8_ = &this->heuristicTemporalSplit;
    *(void **)((long)_Var33.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x20) = pvVar34;
    *(ulong *)((long)_Var33.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x10) = uVar44;
    *(ulong *)((long)_Var33.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl + 0x18) = uVar44;
    local_1988._8_8_ = &lprims;
    pSVar15 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pvVar17 = (vint *)(current->prims).super_PrimInfoMB.object_range._end;
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_4_ = 0x7f800000;
    children.children.items[0]._12_4_ = 0x7f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    uVar6 = vmovlps_avx(auVar54);
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )_Var33.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    lprims = (PrimRefVector)
             _Var33.
             super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl;
    vSplitMask.field_0._0_8_ = BVar32;
    vSplitMask.field_0._8_8_ = &time_range0;
    if ((ulong)((long)pvVar17 - (long)pSVar15) < 0xc00) {
      isLeft.split = pSVar15;
      isLeft.vSplitPos = pvVar17;
      ::anon_func::anon_class_40_5_808acc65::operator()
                ((PrimInfoMB *)values,(anon_class_40_5_808acc65 *)&vSplitMask,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
      vSplitPos.field_0.v[1] = (longlong)pSVar15;
      vSplitPos.field_0.v[0] = (longlong)pvVar17;
      local_1748._0_8_ = 0x80;
      _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values,(d1 *)&vSplitPos,
                 (blocked_range<unsigned_long> *)&children,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                 (anon_class_16_2_ed117de8_conflict29 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&isLeft,in_stack_ffffffffffffe598);
      cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar29 != '\0') {
        prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar35,"task cancelled");
        __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    }
    uVar41 = (current->prims).super_PrimInfoMB.object_range._end -
             (current->prims).super_PrimInfoMB.object_range._begin;
    if (values[1]._8_8_ - values[1].ref.ptr != uVar41) {
      children.children.items[0].depth = (size_t)&time_range0;
      values[1]._8_8_ =
           parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                     (lprims->items,0,uVar41,0x400,(anon_class_8_1_41ce32a5 *)&children);
    }
    fVar5 = time_range0.upper;
    fVar53 = time_range0.lower;
    pmVar13 = lprims;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)values);
    children.children.items[0].prims.super_PrimInfoMB.max_time_range = (BBox1f)pmVar13;
    auVar63._4_4_ = children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_;
    auVar63._0_4_ =
         (undefined4)children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments;
    auVar63._8_8_ = 0;
    auVar21._4_4_ = fVar5;
    auVar21._0_4_ = fVar53;
    auVar21._8_8_ = 0;
    auVar64 = vcmpps_avx(auVar63,auVar21,1);
    auVar20 = vinsertps_avx(auVar21,auVar63,0x50);
    auVar54 = vblendps_avx(auVar63,auVar21,2);
    auVar54 = vblendvps_avx(auVar54,auVar20,auVar64);
    uVar6 = vmovlps_avx(auVar54);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    SetMB::operator=(&local_1468,(SetMB *)&children);
    prVar2 = &(current->prims).super_PrimInfoMB.object_range;
    pcVar18 = (code *)(current->prims).super_PrimInfoMB.object_range._end;
    aVar26._0_8_ = prVar2->_begin;
    aVar26._8_8_ = prVar2->_end;
    children.children.items[0].depth = 0x7f8000007f800000;
    children.children.items[0]._8_4_ = 0x7f800000;
    children.children.items[0]._12_4_ = 0x7f800000;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds0.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[0] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[1] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[2] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .geomBounds.bounds1.upper.field_0.m128[3] = INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[0] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[1] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[2] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.lower.field_0.m128[3] = -INFINITY;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._0_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
    .centBounds.upper.field_0._8_8_ = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._begin = 0;
    children.children.items[0].prims.super_PrimInfoMB.object_range._end = 0;
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._0_4_ = 0;
    auVar64._8_4_ = 0x3f800000;
    auVar64._0_8_ = 0x3f8000003f800000;
    auVar64._12_4_ = 0x3f800000;
    uVar6 = vmovlps_avx(auVar64);
    children.children.items[0].prims.super_PrimInfoMB.num_time_segments._4_4_ = (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ = 0;
    _reduction2 = BVar32;
    if ((long)pcVar18 - prVar2->_begin < 0xc00) {
      vSplitPos.field_0 = aVar26;
      ::anon_func::anon_class_24_3_35f68c7c::operator()
                ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                 (range<unsigned_long> *)&vSplitPos);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
      vSplitPos_1.field_0.v[1] = (longlong)&reduction2;
      vSplitPos_1.field_0.v[0] = (longlong)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
      _reduction = pcVar18;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&children,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitPos_1,
                 (anon_class_16_2_ed117de8_conflict30 *)
                 PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                 (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                  *)&vSplitPos,in_stack_ffffffffffffe598);
      cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
      if (cVar29 != '\0') {
        prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar35,"task cancelled");
        __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
    }
    uVar41 = (current->prims).super_PrimInfoMB.object_range._begin;
    end_00 = (current->prims).super_PrimInfoMB.object_range._end;
    if (local_1888[0]._8_8_ - local_1888[0]._0_8_ != end_00 - uVar41) {
      children.children.items[0].depth = (size_t)&time_range1;
      parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                ((PrimRefMB *)
                 ((anon_class_16_2_ed117de8_conflict31 *)((long)BVar32 + 0x20))->reduction,uVar41,
                 end_00,0x400,(anon_class_8_1_41ce32a6 *)&children);
    }
    BVar50 = time_range1;
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&children,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
    BVar51 = time_range1;
    auVar65._4_4_ = children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_;
    auVar65._0_4_ =
         (undefined4)children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments;
    auVar65._8_8_ = 0;
    auVar22._8_8_ = 0;
    time_range1.lower = BVar50.lower;
    time_range1.upper = BVar50.upper;
    auVar22._0_4_ = time_range1.lower;
    auVar22._4_4_ = time_range1.upper;
    auVar64 = vcmpps_avx(auVar65,auVar22,1);
    auVar20 = vinsertps_avx(auVar22,auVar65,0x50);
    auVar54 = vblendps_avx(auVar65,auVar22,2);
    auVar54 = vblendvps_avx(auVar54,auVar20,auVar64);
    uVar6 = vmovlps_avx(auVar54);
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._0_4_ =
         (undefined4)uVar6;
    children.children.items[0].prims.super_PrimInfoMB.max_num_time_segments._4_4_ =
         (undefined4)((ulong)uVar6 >> 0x20);
    time_range1 = BVar51;
    children.children.items[0].prims.super_PrimInfoMB.max_time_range = BVar32;
    SetMB::operator=(&local_1508,(SetMB *)&children);
    bVar36 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )new_vector._M_t.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl !=
             (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
    local_1978._0_8_ = set;
    goto LAB_00ccada7;
  case 3:
    SetMB::deterministic_order(set);
    splitByGeometry(this,set,&local_1468,&local_1508);
  }
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  bVar36 = false;
LAB_00ccada7:
  children.numChildren = 1;
  local_18f0 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecord::operator=((BuildRecord *)&children,current);
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  children.sharedPrimVecs.items[0].prims = (current->prims).prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  isLeft.split = (Split *)(current->depth + 1);
  SetMB::SetMB((SetMB *)&isLeft.vSplitMask,&local_1468);
  vSplitPos.field_0.v[0] = current->depth + 1;
  SetMB::SetMB((SetMB *)&local_1748.field_1,&local_1508);
  sVar46 = children.numSharedPrimVecs;
  pSVar12 = children.primvecs.items[0];
  local_19d0._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )new_vector._M_t.
           super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           .
           super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
           ._M_head_impl;
  new_vector._M_t.
  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  if (local_1848 == children.primvecs.items[0]->prims) {
    children.primvecs.items[0]->refCount = children.primvecs.items[0]->refCount + 1;
    pvVar37 = local_1848;
  }
  else {
    pSVar27 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
    pSVar28->prims = local_1848;
    children.sharedPrimVecs.items[sVar46].refCount = 1;
    pvVar37 = children.primvecs.items[0]->prims;
    children.primvecs.items[0] =
         (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
          *)&pSVar27->prims;
  }
  sVar46 = children.numSharedPrimVecs;
  if (local_16b8 == pvVar37) {
    children.primvecs.items[children.numChildren] = pSVar12;
    sVar46 = pSVar12->refCount;
    pSVar12->refCount = sVar46 + 1;
  }
  else {
    pSVar27 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
    children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
    pSVar28->prims = local_16b8;
    children.sharedPrimVecs.items[sVar46].refCount = 1;
    children.primvecs.items[children.numChildren] =
         (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
          *)&pSVar27->prims;
    sVar46 = pSVar12->refCount - 1;
  }
  pSVar12->refCount = sVar46;
  if (sVar46 == 0) {
    pvVar37 = pSVar12->prims;
    if (pvVar37 !=
        (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
         *)0x0) {
      sVar46 = pvVar37->size_alloced;
      pPVar10 = pvVar37->items;
      if (pPVar10 != (PrimRefMB *)0x0) {
        if (sVar46 * 0x50 < 0x1c00000) {
          alignedFree(pPVar10);
        }
        else {
          os_free(pPVar10,sVar46 * 0x50,(pvVar37->alloc).hugepages);
        }
      }
      if (sVar46 != 0) {
        pMVar11 = (pvVar37->alloc).device;
        (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,sVar46 * -0x50,1);
      }
      pvVar37->size_active = 0;
      pvVar37->size_alloced = 0;
      pvVar37->items = (PrimRefMB *)0x0;
    }
    ::operator_delete(pvVar37);
  }
  local_19d0._M_t.
  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  .
  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  ._M_head_impl =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x0;
  BuildRecord::operator=((BuildRecord *)&children,(BuildRecord *)&isLeft);
  BuildRecord::operator=
            ((BuildRecord *)&children.children.items[children.numChildren].depth,
             (BuildRecord *)&vSplitPos);
  children.numChildren = children.numChildren + 1;
  std::
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 *)&local_19d0);
  local_1a08._8_4_ = 0x7f800000;
  local_1a08._0_8_ = 0x7f8000007f800000;
  local_1a08._12_4_ = 0x7f800000;
  auStack_19a0._0_4_ = 0xff800000;
  local_19b0._8_8_ = 0xff800000ff800000;
  auStack_19a0._4_4_ = 0xff800000;
  while( true ) {
    if ((this->cfg).branchingFactor <= children.numChildren) break;
    puVar40 = &children.children.items[0].prims.super_PrimInfoMB.object_range._end;
    sVar46 = 0xffffffffffffffff;
    fVar53 = -INFINITY;
    for (sVar47 = 0; children.numChildren != sVar47; sVar47 = sVar47 + 1) {
      if ((this->cfg).minLeafSize < *puVar40 - ((range<unsigned_long> *)(puVar40 + -1))->_begin) {
        auVar20 = vsubps_avx(*(undefined1 (*) [16])(puVar40 + -0xb),
                             *(undefined1 (*) [16])(puVar40 + -0xd));
        auVar21 = vsubps_avx(*(undefined1 (*) [16])(puVar40 + -7),
                             *(undefined1 (*) [16])(puVar40 + -9));
        auVar54 = vinsertps_avx(auVar21,auVar20,0x4c);
        auVar64 = vshufpd_avx(auVar20,auVar20,1);
        auVar64 = vinsertps_avx(auVar64,auVar21,0x9c);
        auVar20 = vinsertps_avx(auVar20,auVar21,0x1c);
        auVar67._0_4_ =
             auVar20._0_4_ * (auVar54._0_4_ + auVar64._0_4_) + auVar54._0_4_ * auVar64._0_4_;
        auVar67._4_4_ =
             auVar20._4_4_ * (auVar54._4_4_ + auVar64._4_4_) + auVar54._4_4_ * auVar64._4_4_;
        auVar67._8_4_ =
             auVar20._8_4_ * (auVar54._8_4_ + auVar64._8_4_) + auVar54._8_4_ * auVar64._8_4_;
        auVar67._12_4_ =
             auVar20._12_4_ * (auVar54._12_4_ + auVar64._12_4_) + auVar54._12_4_ * auVar64._12_4_;
        auVar54 = vhaddps_avx(auVar67,auVar67);
        fVar5 = auVar54._0_4_ * 0.5;
        if (fVar53 < fVar5) {
          sVar46 = sVar47;
          fVar53 = fVar5;
        }
      }
      puVar40 = puVar40 + 0x16;
    }
    if (sVar46 == 0xffffffffffffffff) break;
    lVar48 = sVar46 * 0xb0;
    isLeft.split = (Split *)(current->depth + 1);
    vSplitPos.field_0.v[0] = (longlong)isLeft.split;
    set_00 = &children.children.items[sVar46].prims;
    find((Split *)&time_range0,this,set_00);
    switch(uStack_160c) {
    case 0:
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      local_1988._0_8_ = (LocalChildList_conflict *)0xff800000ff800000;
      local_1988._8_8_ = (PrimRefVector *)0xff800000ff800000;
      local_1978._0_8_ = (SetMB *)0x7f8000007f800000;
      local_1978._8_4_ = INFINITY;
      local_1978._12_4_ = INFINITY;
      local_1968[0].m128[0] = -INFINITY;
      local_1968[0].m128[1] = -INFINITY;
      local_1968[0].m128[2] = -INFINITY;
      local_1968[0].m128[3] = -INFINITY;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      vmovlps_avx(auVar71);
      _reduction = (code *)0x7f8000007f800000;
      local_1788 = 0;
      uStack_1780 = 0;
      vmovlps_avx(auVar71);
      sVar47 = children.children.items[sVar46].prims.super_PrimInfoMB.object_range._end;
      auVar24._4_4_ = uStack_160c;
      auVar24._0_4_ = local_1610.pos;
      auVar24._8_8_ = sStack_1608;
      vSplitPos_1.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar24,0);
      time_range1 = *(BBox1f *)
                     (mm_lookupmask_ps + (long)(1 << (time_range0.upper._0_1_ & 0x1f)) * 0x10);
      _reduction2 = &time_range0;
      sVar31 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)(*(long *)((long)values + lVar48 + -0xcf0) + 0x20),
                          children.children.items[sVar46].prims.super_PrimInfoMB.object_range._begin
                          ,sVar47,(EmptyTy *)local_17f8,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                          (anon_class_24_3_c5d13451 *)&reduction2,(anon_class_1_0_00000001 *)&lprims
                          ,&reduction2_1,0x80,0xc00);
      local_1848 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar48 + -0xcf0);
      local_1a48._8_8_ = 0;
      local_1a48._0_8_ = *(ulong *)((long)values + lVar48 + -0xcf8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft.vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask);
      auVar57._8_8_ = 0;
      auVar57._0_4_ = local_1850.lower;
      auVar57._4_4_ = local_1850.upper;
      auVar64 = vcmpps_avx(auVar57,local_1a48,1);
      auVar20 = vinsertps_avx(local_1a48,auVar57,0x50);
      auVar54 = vblendps_avx(auVar57,local_1a48,2);
      auVar54 = vblendvps_avx(auVar54,auVar20,auVar64);
      local_1850 = (BBox1f)vmovlps_avx(auVar54);
      pvVar37 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  **)((long)values + lVar48 + -0xcf0);
      local_1a48._8_8_ = 0;
      local_1a48._0_8_ = *(ulong *)((long)values + lVar48 + -0xcf8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1748.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction);
      auVar58._8_8_ = 0;
      auVar58._0_4_ = local_16c0.lower;
      auVar58._4_4_ = local_16c0.upper;
      auVar64 = vcmpps_avx(auVar58,local_1a48,1);
      auVar20 = vinsertps_avx(local_1a48,auVar58,0x50);
      auVar54 = vblendps_avx(auVar58,local_1a48,2);
      auVar54 = vblendvps_avx(auVar54,auVar20,auVar64);
      local_16c0 = (BBox1f)vmovlps_avx(auVar54);
      local_16e8 = sVar31;
      local_16e0 = sVar47;
      local_16b8 = pvVar37;
      break;
    case 1:
      SetMB::deterministic_order(set_00);
      splitFallback(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1748.field_1);
      break;
    case 2:
      time_range0_1.lower = *(float *)((long)values + lVar48 + -0xcf8);
      time_range0_1.upper = local_1610.fpos;
      time_range1_1.lower = local_1610.fpos;
      time_range1_1.upper = *(float *)((long)values + lVar48 + -0xcf4);
      BVar32 = *(BBox1f *)((long)values + lVar48 + -0xcf0);
      _Var33.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar11 = (this->heuristicTemporalSplit).device;
      *(long *)((long)_Var33.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      BVar50 = (BBox1f)children.children.items[sVar46].prims.super_PrimInfoMB.object_range._end;
      uVar41 = children.children.items[sVar46].prims.super_PrimInfoMB.object_range._begin;
      *(MemoryMonitorInterface **)
       _Var33.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar11;
      *(undefined1 *)
       ((long)_Var33.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var33.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var33.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar48 = (long)BVar50 - uVar41;
      BVar51 = BVar50;
      if (lVar48 != 0) {
        uVar44 = lVar48 * 0x50;
        (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,uVar44,0);
        if (uVar44 < 0x1c00000) {
          pvVar34 = alignedMalloc(uVar44,0x10);
        }
        else {
          pvVar34 = os_malloc(uVar44,(bool *)((long)_Var33.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var33.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar34;
        *(long *)((long)_Var33.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar48;
        *(long *)((long)_Var33.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar48;
        BVar51 = (BBox1f)children.children.items[sVar46].prims.super_PrimInfoMB.object_range._begin;
        BVar50 = (BBox1f)children.children.items[sVar46].prims.super_PrimInfoMB.object_range._end;
      }
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      uVar44 = vmovlps_avx(auVar59);
      new_vector_1._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var33.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims_1 = (PrimRefVector)
                 _Var33.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl;
      time_range1 = BVar32;
      if ((ulong)((long)BVar50 - (long)BVar51) < 0xc00) {
        _reduction2 = BVar51;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)&reduction,(anon_class_40_5_808acc65 *)&time_range1,
                   (range<unsigned_long> *)&reduction2);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&reduction2,(context_traits)0x4,CUSTOM_CTX);
        vSplitPos_1.field_0._8_4_ = BVar51.lower;
        vSplitPos_1.field_0._12_4_ = BVar51.upper;
        vSplitPos_1.field_0._0_4_ = BVar50.lower;
        vSplitPos_1.field_0._4_4_ = BVar50.upper;
        lprims = (PrimRefVector)PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_19b8 = &time_range1;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,(d1 *)&vSplitPos_1,
                   (blocked_range<unsigned_long> *)&vSplitMask,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&lprims,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&reduction2,in_stack_ffffffffffffe598);
        cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&reduction2);
        if (cVar29 != '\0') {
          prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar35,"task cancelled");
          __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&reduction2);
      }
      uVar41 = children.children.items[sVar46].prims.super_PrimInfoMB.object_range._end -
               children.children.items[sVar46].prims.super_PrimInfoMB.object_range._begin;
      if (uStack_1780 - local_1788 != uVar41) {
        vSplitMask.field_0._0_8_ = &time_range0_1;
        uStack_1780 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                (lprims_1->items,0,uVar41,0x400,
                                 (anon_class_8_1_41ce32a5 *)&vSplitMask);
      }
      auVar25._4_4_ = time_range0_1.upper;
      auVar25._0_4_ = time_range0_1.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar44 >> 0x20;
      auVar25._8_8_ = 0;
      auVar64 = vcmpps_avx(auVar60,auVar25,1);
      auVar20 = vinsertps_avx(auVar25,auVar60,0x50);
      auVar54 = vblendps_avx(auVar60,auVar25,2);
      auVar54 = vblendvps_avx(auVar54,auVar20,auVar64);
      vmovlps_avx(auVar54);
      SetMB::operator=((SetMB *)&isLeft.vSplitMask,(SetMB *)&vSplitMask);
      pBVar45 = (BBox1f *)children.children.items[sVar46].prims.super_PrimInfoMB.object_range._begin
      ;
      vSplitMask.field_0._0_8_ = 0x7f8000007f800000;
      vSplitMask.field_0._8_8_ = 0x7f8000007f800000;
      local_1988._0_8_ = (LocalChildList_conflict *)0xff800000ff800000;
      local_1988._8_8_ = (PrimRefVector *)0xff800000ff800000;
      local_1978._0_8_ = (SetMB *)0x7f8000007f800000;
      local_1978._8_4_ = INFINITY;
      local_1978._12_4_ = INFINITY;
      local_1968[0].m128[0] = -INFINITY;
      local_1968[0].m128[1] = -INFINITY;
      local_1968[0].m128[2] = -INFINITY;
      local_1968[0].m128[3] = -INFINITY;
      auVar61._8_4_ = 0x3f800000;
      auVar61._0_8_ = 0x3f8000003f800000;
      auVar61._12_4_ = 0x3f800000;
      uVar44 = vmovlps_avx(auVar61);
      pmVar13 = (PrimRefVector)
                children.children.items[sVar46].prims.super_PrimInfoMB.object_range._end;
      _reduction2_1 = BVar32;
      if ((ulong)((long)pmVar13 - (long)pBVar45) < 0xc00) {
        vSplitPos_1.field_0.v[1] = (longlong)pmVar13;
        vSplitPos_1.field_0.v[0] = (longlong)pBVar45;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&reduction2,(anon_class_24_3_35f68c7c *)&reduction2_1,
                   (range<unsigned_long> *)&vSplitPos_1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos_1,(context_traits)0x4,CUSTOM_CTX);
        local_19b0._0_8_ = 0x80;
        local_17f8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_17f8._8_8_ = &reduction2_1;
        lprims = pmVar13;
        local_19b8 = pBVar45;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction2,(d1 *)&lprims,
                   (blocked_range<unsigned_long> *)&vSplitMask,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_17f8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos_1,in_stack_ffffffffffffe598);
        cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos_1);
        if (cVar29 != '\0') {
          prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar35,"task cancelled");
          __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos_1)
        ;
      }
      lVar48 = local_1640 - local_1648;
      local_1648 = children.children.items[sVar46].prims.super_PrimInfoMB.object_range._begin;
      local_1640 = lVar48 + local_1648;
      uVar41 = children.children.items[sVar46].prims.super_PrimInfoMB.object_range._end;
      if (lVar48 != uVar41 - local_1648) {
        vSplitMask.field_0._0_8_ = &time_range1_1;
        local_1640 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (*(PrimRefMB **)((long)BVar32 + 0x20),local_1648,uVar41,0x400,
                                (anon_class_8_1_41ce32a6 *)&vSplitMask);
      }
      local_1a38._4_4_ = time_range1_1.upper;
      local_1a38._0_4_ = time_range1_1.lower;
      local_1a38._8_8_ = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&vSplitMask,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction2);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar44 >> 0x20;
      auVar64 = vcmpps_avx(auVar62,local_1a38,1);
      auVar20 = vinsertps_avx(local_1a38,auVar62,0x50);
      auVar54 = vblendps_avx(auVar62,local_1a38,2);
      auVar54 = vblendvps_avx(auVar54,auVar20,auVar64);
      vmovlps_avx(auVar54);
      SetMB::operator=((SetMB *)&local_1748.field_1,(SetMB *)&vSplitMask);
      _Var49._M_head_impl =
           (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
            *)new_vector_1;
      goto LAB_00ccb3b2;
    case 3:
      SetMB::deterministic_order(set_00);
      splitByGeometry(this,set_00,(SetMB *)&isLeft.vSplitMask,(SetMB *)&local_1748.field_1);
      break;
    default:
      _Var49._M_head_impl =
           (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
            *)0x0;
      goto LAB_00ccb3b2;
    }
    _Var49._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
LAB_00ccb3b2:
    sVar47 = children.numSharedPrimVecs;
    new_vector_1._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar12 = children.primvecs.items[sVar46];
    if (local_1848 == pSVar12->prims) {
      pSVar12->refCount = pSVar12->refCount + 1;
      pvVar37 = local_1848;
    }
    else {
      pSVar27 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar28->prims = local_1848;
      children.sharedPrimVecs.items[sVar47].refCount = 1;
      children.primvecs.items[sVar46] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar27->prims;
      pvVar37 = pSVar12->prims;
    }
    sVar47 = children.numSharedPrimVecs;
    if (local_16b8 == pvVar37) {
      children.primvecs.items[children.numChildren] = pSVar12;
      sVar47 = pSVar12->refCount;
      pSVar12->refCount = sVar47 + 1;
    }
    else {
      pSVar27 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar28 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar28->prims = local_16b8;
      children.sharedPrimVecs.items[sVar47].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar27->prims;
      sVar47 = pSVar12->refCount - 1;
    }
    pSVar12->refCount = sVar47;
    if (sVar47 == 0) {
      pvVar37 = pSVar12->prims;
      local_19d8._M_head_impl = _Var49._M_head_impl;
      if (pvVar37 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar47 = pvVar37->size_alloced;
        pPVar10 = pvVar37->items;
        if (pPVar10 != (PrimRefMB *)0x0) {
          if (sVar47 * 0x50 < 0x1c00000) {
            alignedFree(pPVar10);
          }
          else {
            os_free(pPVar10,sVar47 * 0x50,(pvVar37->alloc).hugepages);
          }
        }
        if (sVar47 != 0) {
          pMVar11 = (pvVar37->alloc).device;
          (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,sVar47 * -0x50,1);
        }
        pvVar37->size_active = 0;
        pvVar37->size_alloced = 0;
        pvVar37->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar37);
    }
    local_19d8._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecord::operator=
              ((BuildRecord *)&children.children.items[sVar46].depth,(BuildRecord *)&isLeft);
    BuildRecord::operator=
              ((BuildRecord *)&children.children.items[children.numChildren].depth,
               (BuildRecord *)&vSplitPos);
    children.numChildren = children.numChildren + 1;
    bVar36 = bVar36 | (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                       )_Var49._M_head_impl !=
                      (_Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                       )0x0;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_19d8);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector_1);
  }
  pfVar39 = &children.children.items[0].prims.super_PrimInfoMB.time_range.upper;
  sVar46 = children.numChildren;
  while (bVar52 = sVar46 != 0, sVar46 = sVar46 - 1, bVar52) {
    auVar54 = vcmpps_avx(ZEXT416((uint)(current->prims).super_PrimInfoMB.time_range.lower),
                         ZEXT416((uint)((BBox1f *)(pfVar39 + -1))->lower),1);
    auVar64 = vcmpps_avx(ZEXT416((uint)*pfVar39),
                         ZEXT416((uint)(current->prims).super_PrimInfoMB.time_range.upper),1);
    auVar54 = vorps_avx(auVar54,auVar64);
    bVar36 = bVar36 | auVar54[0];
    pfVar39 = pfVar39 + 0x2c;
  }
  if ((bVar36 & 1) == 0) {
    _reduction = (code *)&DAT_000001c0;
    pTVar14 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
      vSplitPos.field_0.v[1]._0_1_ = 1;
      vSplitPos.field_0.v[0] = (longlong)pTVar14;
      MutexSys::lock(&pTVar14->mutex);
      if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar3 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
             ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar3 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
        (paVar3->super___atomic_base<unsigned_long>)._M_i =
             (paVar3->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar66 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar14->alloc0).end = auVar66._0_8_;
      (pTVar14->alloc0).allocBlockSize = auVar66._8_8_;
      (pTVar14->alloc0).bytesUsed = auVar66._16_8_;
      (pTVar14->alloc0).bytesWasted = auVar66._24_8_;
      (pTVar14->alloc0).ptr = (char *)auVar66._0_8_;
      (pTVar14->alloc0).cur = auVar66._8_8_;
      (pTVar14->alloc0).end = auVar66._16_8_;
      (pTVar14->alloc0).allocBlockSize = auVar66._24_8_;
      auVar66 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar14->alloc1).end = auVar66._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar66._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar66._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar66._24_8_;
        (pTVar14->alloc1).ptr = (char *)auVar66._0_8_;
        (pTVar14->alloc1).cur = auVar66._8_8_;
        (pTVar14->alloc1).end = auVar66._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar66._24_8_;
      }
      else {
        (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar14->alloc1).ptr = (char *)auVar66._0_8_;
        (pTVar14->alloc1).cur = auVar66._8_8_;
        (pTVar14->alloc1).end = auVar66._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar66._24_8_;
        (pTVar14->alloc1).end = auVar66._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar66._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar66._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar66._24_8_;
        (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar14->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
      isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
      vSplitMask.field_0._0_8_ = pTVar14;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vSplitMask);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&isLeft);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vSplitPos);
    }
    (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + (long)_reduction);
    sVar46 = (alloc.talloc0)->cur;
    uVar44 = (ulong)(-(int)sVar46 & 0x1f);
    puVar42 = (undefined1 *)(sVar46 + (long)_reduction) + uVar44;
    (alloc.talloc0)->cur = (size_t)puVar42;
    if ((undefined1 *)(alloc.talloc0)->end < puVar42) {
      (alloc.talloc0)->cur = sVar46;
      if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
      }
      else {
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar43;
        sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar46;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
          pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
          (alloc.talloc0)->ptr = pcVar43;
          sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar46;
          (alloc.talloc0)->end = (size_t)isLeft.split;
          (alloc.talloc0)->cur = (size_t)_reduction;
          if (isLeft.split < _reduction) {
            (alloc.talloc0)->cur = 0;
            pcVar43 = (char *)0x0;
            goto LAB_00ccbfaa;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar46;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar44;
      pcVar43 = (alloc.talloc0)->ptr + ((long)puVar42 - (long)_reduction);
    }
LAB_00ccbfaa:
    pcVar43[0xc0] = '\0';
    pcVar43[0xc1] = '\0';
    pcVar43[0xc2] = -0x80;
    pcVar43[0xc3] = '\x7f';
    pcVar43[0xc4] = '\0';
    pcVar43[0xc5] = '\0';
    pcVar43[0xc6] = -0x80;
    pcVar43[199] = '\x7f';
    pcVar43[200] = '\0';
    pcVar43[0xc9] = '\0';
    pcVar43[0xca] = -0x80;
    pcVar43[0xcb] = '\x7f';
    pcVar43[0xcc] = '\0';
    pcVar43[0xcd] = '\0';
    pcVar43[0xce] = -0x80;
    pcVar43[0xcf] = '\x7f';
    pcVar43[0xd0] = '\0';
    pcVar43[0xd1] = '\0';
    pcVar43[0xd2] = -0x80;
    pcVar43[0xd3] = '\x7f';
    pcVar43[0xd4] = '\0';
    pcVar43[0xd5] = '\0';
    pcVar43[0xd6] = -0x80;
    pcVar43[0xd7] = '\x7f';
    pcVar43[0xd8] = '\0';
    pcVar43[0xd9] = '\0';
    pcVar43[0xda] = -0x80;
    pcVar43[0xdb] = '\x7f';
    pcVar43[0xdc] = '\0';
    pcVar43[0xdd] = '\0';
    pcVar43[0xde] = -0x80;
    pcVar43[0xdf] = '\x7f';
    pcVar43[0x80] = '\0';
    pcVar43[0x81] = '\0';
    pcVar43[0x82] = -0x80;
    pcVar43[0x83] = '\x7f';
    pcVar43[0x84] = '\0';
    pcVar43[0x85] = '\0';
    pcVar43[0x86] = -0x80;
    pcVar43[0x87] = '\x7f';
    pcVar43[0x88] = '\0';
    pcVar43[0x89] = '\0';
    pcVar43[0x8a] = -0x80;
    pcVar43[0x8b] = '\x7f';
    pcVar43[0x8c] = '\0';
    pcVar43[0x8d] = '\0';
    pcVar43[0x8e] = -0x80;
    pcVar43[0x8f] = '\x7f';
    pcVar43[0x90] = '\0';
    pcVar43[0x91] = '\0';
    pcVar43[0x92] = -0x80;
    pcVar43[0x93] = '\x7f';
    pcVar43[0x94] = '\0';
    pcVar43[0x95] = '\0';
    pcVar43[0x96] = -0x80;
    pcVar43[0x97] = '\x7f';
    pcVar43[0x98] = '\0';
    pcVar43[0x99] = '\0';
    pcVar43[0x9a] = -0x80;
    pcVar43[0x9b] = '\x7f';
    pcVar43[0x9c] = '\0';
    pcVar43[0x9d] = '\0';
    pcVar43[0x9e] = -0x80;
    pcVar43[0x9f] = '\x7f';
    pcVar43[0x40] = '\0';
    pcVar43[0x41] = '\0';
    pcVar43[0x42] = -0x80;
    pcVar43[0x43] = '\x7f';
    pcVar43[0x44] = '\0';
    pcVar43[0x45] = '\0';
    pcVar43[0x46] = -0x80;
    pcVar43[0x47] = '\x7f';
    pcVar43[0x48] = '\0';
    pcVar43[0x49] = '\0';
    pcVar43[0x4a] = -0x80;
    pcVar43[0x4b] = '\x7f';
    pcVar43[0x4c] = '\0';
    pcVar43[0x4d] = '\0';
    pcVar43[0x4e] = -0x80;
    pcVar43[0x4f] = '\x7f';
    pcVar43[0x50] = '\0';
    pcVar43[0x51] = '\0';
    pcVar43[0x52] = -0x80;
    pcVar43[0x53] = '\x7f';
    pcVar43[0x54] = '\0';
    pcVar43[0x55] = '\0';
    pcVar43[0x56] = -0x80;
    pcVar43[0x57] = '\x7f';
    pcVar43[0x58] = '\0';
    pcVar43[0x59] = '\0';
    pcVar43[0x5a] = -0x80;
    pcVar43[0x5b] = '\x7f';
    pcVar43[0x5c] = '\0';
    pcVar43[0x5d] = '\0';
    pcVar43[0x5e] = -0x80;
    pcVar43[0x5f] = '\x7f';
    pcVar43[0xe0] = '\0';
    pcVar43[0xe1] = '\0';
    pcVar43[0xe2] = -0x80;
    pcVar43[0xe3] = -1;
    pcVar43[0xe4] = '\0';
    pcVar43[0xe5] = '\0';
    pcVar43[0xe6] = -0x80;
    pcVar43[0xe7] = -1;
    pcVar43[0xe8] = '\0';
    pcVar43[0xe9] = '\0';
    pcVar43[0xea] = -0x80;
    pcVar43[0xeb] = -1;
    pcVar43[0xec] = '\0';
    pcVar43[0xed] = '\0';
    pcVar43[0xee] = -0x80;
    pcVar43[0xef] = -1;
    pcVar43[0xf0] = '\0';
    pcVar43[0xf1] = '\0';
    pcVar43[0xf2] = -0x80;
    pcVar43[0xf3] = -1;
    pcVar43[0xf4] = '\0';
    pcVar43[0xf5] = '\0';
    pcVar43[0xf6] = -0x80;
    pcVar43[0xf7] = -1;
    pcVar43[0xf8] = '\0';
    pcVar43[0xf9] = '\0';
    pcVar43[0xfa] = -0x80;
    pcVar43[0xfb] = -1;
    pcVar43[0xfc] = '\0';
    pcVar43[0xfd] = '\0';
    pcVar43[0xfe] = -0x80;
    pcVar43[0xff] = -1;
    pcVar43[0xa0] = '\0';
    pcVar43[0xa1] = '\0';
    pcVar43[0xa2] = -0x80;
    pcVar43[0xa3] = -1;
    pcVar43[0xa4] = '\0';
    pcVar43[0xa5] = '\0';
    pcVar43[0xa6] = -0x80;
    pcVar43[0xa7] = -1;
    pcVar43[0xa8] = '\0';
    pcVar43[0xa9] = '\0';
    pcVar43[0xaa] = -0x80;
    pcVar43[0xab] = -1;
    pcVar43[0xac] = '\0';
    pcVar43[0xad] = '\0';
    pcVar43[0xae] = -0x80;
    pcVar43[0xaf] = -1;
    pcVar43[0xb0] = '\0';
    pcVar43[0xb1] = '\0';
    pcVar43[0xb2] = -0x80;
    pcVar43[0xb3] = -1;
    pcVar43[0xb4] = '\0';
    pcVar43[0xb5] = '\0';
    pcVar43[0xb6] = -0x80;
    pcVar43[0xb7] = -1;
    pcVar43[0xb8] = '\0';
    pcVar43[0xb9] = '\0';
    pcVar43[0xba] = -0x80;
    pcVar43[0xbb] = -1;
    pcVar43[0xbc] = '\0';
    pcVar43[0xbd] = '\0';
    pcVar43[0xbe] = -0x80;
    pcVar43[0xbf] = -1;
    pcVar43[0x60] = '\0';
    pcVar43[0x61] = '\0';
    pcVar43[0x62] = -0x80;
    pcVar43[99] = -1;
    pcVar43[100] = '\0';
    pcVar43[0x65] = '\0';
    pcVar43[0x66] = -0x80;
    pcVar43[0x67] = -1;
    pcVar43[0x68] = '\0';
    pcVar43[0x69] = '\0';
    pcVar43[0x6a] = -0x80;
    pcVar43[0x6b] = -1;
    pcVar43[0x6c] = '\0';
    pcVar43[0x6d] = '\0';
    pcVar43[0x6e] = -0x80;
    pcVar43[0x6f] = -1;
    pcVar43[0x70] = '\0';
    pcVar43[0x71] = '\0';
    pcVar43[0x72] = -0x80;
    pcVar43[0x73] = -1;
    pcVar43[0x74] = '\0';
    pcVar43[0x75] = '\0';
    pcVar43[0x76] = -0x80;
    pcVar43[0x77] = -1;
    pcVar43[0x78] = '\0';
    pcVar43[0x79] = '\0';
    pcVar43[0x7a] = -0x80;
    pcVar43[0x7b] = -1;
    pcVar43[0x7c] = '\0';
    pcVar43[0x7d] = '\0';
    pcVar43[0x7e] = -0x80;
    pcVar43[0x7f] = -1;
    auVar66 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar43 + 0x100) = auVar66;
    *(undefined1 (*) [32])(pcVar43 + 0x120) = auVar66;
    auVar66 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar43 + 0x140) = auVar66;
    *(undefined1 (*) [32])(pcVar43 + 0x160) = auVar66;
    *(undefined1 (*) [32])(pcVar43 + 0x180) = auVar66;
    *(undefined1 (*) [32])(pcVar43 + 0x1a0) = auVar66;
    for (lVar48 = 0; lVar48 != 8; lVar48 = lVar48 + 1) {
      pcVar4 = pcVar43 + lVar48 * 8;
      pcVar4[0] = '\b';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
    }
    goto LAB_00ccc03c;
  }
  _reduction = (code *)0x200;
  pTVar14 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
    vSplitPos.field_0.v[1]._0_1_ = 1;
    vSplitPos.field_0.v[0] = (longlong)pTVar14;
    MutexSys::lock(&pTVar14->mutex);
    if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar3 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
           ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar3 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar66 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar14->alloc0).end = auVar66._0_8_;
    (pTVar14->alloc0).allocBlockSize = auVar66._8_8_;
    (pTVar14->alloc0).bytesUsed = auVar66._16_8_;
    (pTVar14->alloc0).bytesWasted = auVar66._24_8_;
    (pTVar14->alloc0).ptr = (char *)auVar66._0_8_;
    (pTVar14->alloc0).cur = auVar66._8_8_;
    (pTVar14->alloc0).end = auVar66._16_8_;
    (pTVar14->alloc0).allocBlockSize = auVar66._24_8_;
    auVar66 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar14->alloc1).end = auVar66._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar66._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar66._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar66._24_8_;
      (pTVar14->alloc1).ptr = (char *)auVar66._0_8_;
      (pTVar14->alloc1).cur = auVar66._8_8_;
      (pTVar14->alloc1).end = auVar66._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar66._24_8_;
    }
    else {
      (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar14->alloc1).ptr = (char *)auVar66._0_8_;
      (pTVar14->alloc1).cur = auVar66._8_8_;
      (pTVar14->alloc1).end = auVar66._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar66._24_8_;
      (pTVar14->alloc1).end = auVar66._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar66._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar66._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar66._24_8_;
      (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar14->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    isLeft.split = (Split *)&FastAllocator::s_thread_local_allocators_lock;
    isLeft.vSplitPos = (vint *)CONCAT71(isLeft.vSplitPos._1_7_,1);
    vSplitMask.field_0._0_8_ = pTVar14;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&vSplitMask);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&isLeft);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&vSplitPos);
  }
  (alloc.talloc0)->bytesUsed = (size_t)((alloc.talloc0)->bytesUsed + (long)_reduction);
  sVar46 = (alloc.talloc0)->cur;
  uVar44 = (ulong)(-(int)sVar46 & 0x1f);
  puVar42 = (undefined1 *)(sVar46 + (long)_reduction) + uVar44;
  (alloc.talloc0)->cur = (size_t)puVar42;
  if ((undefined1 *)(alloc.talloc0)->end < puVar42) {
    (alloc.talloc0)->cur = sVar46;
    if ((Split *)(alloc.talloc0)->allocBlockSize < (Split *)((long)_reduction << 2)) {
      pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&reduction);
    }
    else {
      isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
      pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
      (alloc.talloc0)->ptr = pcVar43;
      sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar46;
      (alloc.talloc0)->end = (size_t)isLeft.split;
      (alloc.talloc0)->cur = (size_t)_reduction;
      if (isLeft.split < _reduction) {
        (alloc.talloc0)->cur = 0;
        isLeft.split = (Split *)(alloc.talloc0)->allocBlockSize;
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&isLeft);
        (alloc.talloc0)->ptr = pcVar43;
        sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar46;
        (alloc.talloc0)->end = (size_t)isLeft.split;
        (alloc.talloc0)->cur = (size_t)_reduction;
        if (isLeft.split < _reduction) {
          (alloc.talloc0)->cur = 0;
          pcVar43 = (char *)0x0;
          goto LAB_00ccbe55;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar46;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar44;
    pcVar43 = (alloc.talloc0)->ptr + ((long)puVar42 - (long)_reduction);
  }
LAB_00ccbe55:
  pcVar43[0x1c0] = '\0';
  pcVar43[0x1c1] = '\0';
  pcVar43[0x1c2] = -0x80;
  pcVar43[0x1c3] = '\x7f';
  pcVar43[0x1c4] = '\0';
  pcVar43[0x1c5] = '\0';
  pcVar43[0x1c6] = -0x80;
  pcVar43[0x1c7] = '\x7f';
  pcVar43[0x1c8] = '\0';
  pcVar43[0x1c9] = '\0';
  pcVar43[0x1ca] = -0x80;
  pcVar43[0x1cb] = '\x7f';
  pcVar43[0x1cc] = '\0';
  pcVar43[0x1cd] = '\0';
  pcVar43[0x1ce] = -0x80;
  pcVar43[0x1cf] = '\x7f';
  pcVar43[0x1d0] = '\0';
  pcVar43[0x1d1] = '\0';
  pcVar43[0x1d2] = -0x80;
  pcVar43[0x1d3] = '\x7f';
  pcVar43[0x1d4] = '\0';
  pcVar43[0x1d5] = '\0';
  pcVar43[0x1d6] = -0x80;
  pcVar43[0x1d7] = '\x7f';
  pcVar43[0x1d8] = '\0';
  pcVar43[0x1d9] = '\0';
  pcVar43[0x1da] = -0x80;
  pcVar43[0x1db] = '\x7f';
  pcVar43[0x1dc] = '\0';
  pcVar43[0x1dd] = '\0';
  pcVar43[0x1de] = -0x80;
  pcVar43[0x1df] = '\x7f';
  pcVar43[0x1e0] = '\0';
  pcVar43[0x1e1] = '\0';
  pcVar43[0x1e2] = -0x80;
  pcVar43[0x1e3] = -1;
  pcVar43[0x1e4] = '\0';
  pcVar43[0x1e5] = '\0';
  pcVar43[0x1e6] = -0x80;
  pcVar43[0x1e7] = -1;
  pcVar43[0x1e8] = '\0';
  pcVar43[0x1e9] = '\0';
  pcVar43[0x1ea] = -0x80;
  pcVar43[0x1eb] = -1;
  pcVar43[0x1ec] = '\0';
  pcVar43[0x1ed] = '\0';
  pcVar43[0x1ee] = -0x80;
  pcVar43[0x1ef] = -1;
  pcVar43[0x1f0] = '\0';
  pcVar43[0x1f1] = '\0';
  pcVar43[0x1f2] = -0x80;
  pcVar43[499] = -1;
  pcVar43[500] = '\0';
  pcVar43[0x1f5] = '\0';
  pcVar43[0x1f6] = -0x80;
  pcVar43[0x1f7] = -1;
  pcVar43[0x1f8] = '\0';
  pcVar43[0x1f9] = '\0';
  pcVar43[0x1fa] = -0x80;
  pcVar43[0x1fb] = -1;
  pcVar43[0x1fc] = '\0';
  pcVar43[0x1fd] = '\0';
  pcVar43[0x1fe] = -0x80;
  pcVar43[0x1ff] = -1;
  pcVar43[0xc0] = '\0';
  pcVar43[0xc1] = '\0';
  pcVar43[0xc2] = -0x80;
  pcVar43[0xc3] = '\x7f';
  pcVar43[0xc4] = '\0';
  pcVar43[0xc5] = '\0';
  pcVar43[0xc6] = -0x80;
  pcVar43[199] = '\x7f';
  pcVar43[200] = '\0';
  pcVar43[0xc9] = '\0';
  pcVar43[0xca] = -0x80;
  pcVar43[0xcb] = '\x7f';
  pcVar43[0xcc] = '\0';
  pcVar43[0xcd] = '\0';
  pcVar43[0xce] = -0x80;
  pcVar43[0xcf] = '\x7f';
  pcVar43[0xd0] = '\0';
  pcVar43[0xd1] = '\0';
  pcVar43[0xd2] = -0x80;
  pcVar43[0xd3] = '\x7f';
  pcVar43[0xd4] = '\0';
  pcVar43[0xd5] = '\0';
  pcVar43[0xd6] = -0x80;
  pcVar43[0xd7] = '\x7f';
  pcVar43[0xd8] = '\0';
  pcVar43[0xd9] = '\0';
  pcVar43[0xda] = -0x80;
  pcVar43[0xdb] = '\x7f';
  pcVar43[0xdc] = '\0';
  pcVar43[0xdd] = '\0';
  pcVar43[0xde] = -0x80;
  pcVar43[0xdf] = '\x7f';
  pcVar43[0x80] = '\0';
  pcVar43[0x81] = '\0';
  pcVar43[0x82] = -0x80;
  pcVar43[0x83] = '\x7f';
  pcVar43[0x84] = '\0';
  pcVar43[0x85] = '\0';
  pcVar43[0x86] = -0x80;
  pcVar43[0x87] = '\x7f';
  pcVar43[0x88] = '\0';
  pcVar43[0x89] = '\0';
  pcVar43[0x8a] = -0x80;
  pcVar43[0x8b] = '\x7f';
  pcVar43[0x8c] = '\0';
  pcVar43[0x8d] = '\0';
  pcVar43[0x8e] = -0x80;
  pcVar43[0x8f] = '\x7f';
  pcVar43[0x90] = '\0';
  pcVar43[0x91] = '\0';
  pcVar43[0x92] = -0x80;
  pcVar43[0x93] = '\x7f';
  pcVar43[0x94] = '\0';
  pcVar43[0x95] = '\0';
  pcVar43[0x96] = -0x80;
  pcVar43[0x97] = '\x7f';
  pcVar43[0x98] = '\0';
  pcVar43[0x99] = '\0';
  pcVar43[0x9a] = -0x80;
  pcVar43[0x9b] = '\x7f';
  pcVar43[0x9c] = '\0';
  pcVar43[0x9d] = '\0';
  pcVar43[0x9e] = -0x80;
  pcVar43[0x9f] = '\x7f';
  pcVar43[0x40] = '\0';
  pcVar43[0x41] = '\0';
  pcVar43[0x42] = -0x80;
  pcVar43[0x43] = '\x7f';
  pcVar43[0x44] = '\0';
  pcVar43[0x45] = '\0';
  pcVar43[0x46] = -0x80;
  pcVar43[0x47] = '\x7f';
  pcVar43[0x48] = '\0';
  pcVar43[0x49] = '\0';
  pcVar43[0x4a] = -0x80;
  pcVar43[0x4b] = '\x7f';
  pcVar43[0x4c] = '\0';
  pcVar43[0x4d] = '\0';
  pcVar43[0x4e] = -0x80;
  pcVar43[0x4f] = '\x7f';
  pcVar43[0x50] = '\0';
  pcVar43[0x51] = '\0';
  pcVar43[0x52] = -0x80;
  pcVar43[0x53] = '\x7f';
  pcVar43[0x54] = '\0';
  pcVar43[0x55] = '\0';
  pcVar43[0x56] = -0x80;
  pcVar43[0x57] = '\x7f';
  pcVar43[0x58] = '\0';
  pcVar43[0x59] = '\0';
  pcVar43[0x5a] = -0x80;
  pcVar43[0x5b] = '\x7f';
  pcVar43[0x5c] = '\0';
  pcVar43[0x5d] = '\0';
  pcVar43[0x5e] = -0x80;
  pcVar43[0x5f] = '\x7f';
  pcVar43[0xe0] = '\0';
  pcVar43[0xe1] = '\0';
  pcVar43[0xe2] = -0x80;
  pcVar43[0xe3] = -1;
  pcVar43[0xe4] = '\0';
  pcVar43[0xe5] = '\0';
  pcVar43[0xe6] = -0x80;
  pcVar43[0xe7] = -1;
  pcVar43[0xe8] = '\0';
  pcVar43[0xe9] = '\0';
  pcVar43[0xea] = -0x80;
  pcVar43[0xeb] = -1;
  pcVar43[0xec] = '\0';
  pcVar43[0xed] = '\0';
  pcVar43[0xee] = -0x80;
  pcVar43[0xef] = -1;
  pcVar43[0xf0] = '\0';
  pcVar43[0xf1] = '\0';
  pcVar43[0xf2] = -0x80;
  pcVar43[0xf3] = -1;
  pcVar43[0xf4] = '\0';
  pcVar43[0xf5] = '\0';
  pcVar43[0xf6] = -0x80;
  pcVar43[0xf7] = -1;
  pcVar43[0xf8] = '\0';
  pcVar43[0xf9] = '\0';
  pcVar43[0xfa] = -0x80;
  pcVar43[0xfb] = -1;
  pcVar43[0xfc] = '\0';
  pcVar43[0xfd] = '\0';
  pcVar43[0xfe] = -0x80;
  pcVar43[0xff] = -1;
  pcVar43[0xa0] = '\0';
  pcVar43[0xa1] = '\0';
  pcVar43[0xa2] = -0x80;
  pcVar43[0xa3] = -1;
  pcVar43[0xa4] = '\0';
  pcVar43[0xa5] = '\0';
  pcVar43[0xa6] = -0x80;
  pcVar43[0xa7] = -1;
  pcVar43[0xa8] = '\0';
  pcVar43[0xa9] = '\0';
  pcVar43[0xaa] = -0x80;
  pcVar43[0xab] = -1;
  pcVar43[0xac] = '\0';
  pcVar43[0xad] = '\0';
  pcVar43[0xae] = -0x80;
  pcVar43[0xaf] = -1;
  pcVar43[0xb0] = '\0';
  pcVar43[0xb1] = '\0';
  pcVar43[0xb2] = -0x80;
  pcVar43[0xb3] = -1;
  pcVar43[0xb4] = '\0';
  pcVar43[0xb5] = '\0';
  pcVar43[0xb6] = -0x80;
  pcVar43[0xb7] = -1;
  pcVar43[0xb8] = '\0';
  pcVar43[0xb9] = '\0';
  pcVar43[0xba] = -0x80;
  pcVar43[0xbb] = -1;
  pcVar43[0xbc] = '\0';
  pcVar43[0xbd] = '\0';
  pcVar43[0xbe] = -0x80;
  pcVar43[0xbf] = -1;
  pcVar43[0x60] = '\0';
  pcVar43[0x61] = '\0';
  pcVar43[0x62] = -0x80;
  pcVar43[99] = -1;
  pcVar43[100] = '\0';
  pcVar43[0x65] = '\0';
  pcVar43[0x66] = -0x80;
  pcVar43[0x67] = -1;
  pcVar43[0x68] = '\0';
  pcVar43[0x69] = '\0';
  pcVar43[0x6a] = -0x80;
  pcVar43[0x6b] = -1;
  pcVar43[0x6c] = '\0';
  pcVar43[0x6d] = '\0';
  pcVar43[0x6e] = -0x80;
  pcVar43[0x6f] = -1;
  pcVar43[0x70] = '\0';
  pcVar43[0x71] = '\0';
  pcVar43[0x72] = -0x80;
  pcVar43[0x73] = -1;
  pcVar43[0x74] = '\0';
  pcVar43[0x75] = '\0';
  pcVar43[0x76] = -0x80;
  pcVar43[0x77] = -1;
  pcVar43[0x78] = '\0';
  pcVar43[0x79] = '\0';
  pcVar43[0x7a] = -0x80;
  pcVar43[0x7b] = -1;
  pcVar43[0x7c] = '\0';
  pcVar43[0x7d] = '\0';
  pcVar43[0x7e] = -0x80;
  pcVar43[0x7f] = -1;
  auVar66 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar43 + 0x100) = auVar66;
  *(undefined1 (*) [32])(pcVar43 + 0x120) = auVar66;
  auVar66 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar43 + 0x140) = auVar66;
  *(undefined1 (*) [32])(pcVar43 + 0x160) = auVar66;
  *(undefined1 (*) [32])(pcVar43 + 0x180) = auVar66;
  *(undefined1 (*) [32])(pcVar43 + 0x1a0) = auVar66;
  local_18f0 = 6;
  for (lVar48 = 0; lVar48 != 8; lVar48 = lVar48 + 1) {
    pcVar4 = pcVar43 + lVar48 * 8;
    pcVar4[0] = '\b';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
  }
LAB_00ccc03c:
  sVar46 = children.numChildren;
  if ((this->cfg).singleThreadThreshold <
      (current->prims).super_PrimInfoMB.object_range._end -
      (current->prims).super_PrimInfoMB.object_range._begin) {
    vSplitMask.field_0._0_8_ = values;
    vSplitMask.field_0._8_8_ = this;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
    vSplitPos.field_0.v[1] = 0;
    vSplitPos.field_0.v[0] = sVar46;
    local_1748._0_8_ = 1;
    _reduction = (code *)&vSplitMask;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::avx::BVHBuilderMSMBlur::BuilderT<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::QuadMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::QuadMesh,embree::QuadMi<4>>,embree::Scene::BuildProgressMonitorInterface>::recurse(embree::avx::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::BVHBuilderMSMBlur::BuilderT<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::QuadMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::QuadMesh,embree::QuadMi<4>>,embree::Scene::BuildProgressMonitorInterface>::recurse(embree::avx::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)&vSplitPos,(anon_class_8_1_898bcfc2 *)&reduction,
               (task_group_context *)&isLeft);
    cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
    if (cVar29 != '\0') {
      prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar35,"task cancelled");
      __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    local_1a48._8_4_ = 0x7f800000;
    local_1a48._0_8_ = 0x7f8000007f800000;
    local_1a48._12_4_ = 0x7f800000;
    local_1a38._8_4_ = 0xff800000;
    local_1a38._0_8_ = 0xff800000ff800000;
    local_1a38._12_4_ = 0xff800000;
    paVar38 = &values[0].lbounds.bounds1.upper.field_0;
    sVar46 = children.numChildren;
    local_1a08 = local_1a48;
    unique0x10007698 = local_1a38;
    while (bVar52 = sVar46 != 0, sVar46 = sVar46 - 1, local_1988._0_8_ = &children, bVar52) {
      local_1a48 = vminps_avx(local_1a48,(undefined1  [16])paVar38[-3]);
      local_1a38 = vmaxps_avx(local_1a38,(undefined1  [16])paVar38[-2]);
      local_1a08 = vminps_avx(local_1a08,*(undefined1 (*) [16])&paVar38[-1].field_1.x);
      unique0x000f2b00 = vmaxps_avx(stack0xffffffffffffe658,(undefined1  [16])*paVar38);
      paVar38 = paVar38 + 6;
    }
  }
  else {
    current_00 = (BuildRecord *)(children.children.items + children.numChildren);
    pBVar45 = &values[children.numChildren - 1].dt;
    local_1a38._8_4_ = 0xff800000;
    local_1a38._0_8_ = 0xff800000ff800000;
    local_1a38._12_4_ = 0xff800000;
    local_1a48._8_4_ = 0x7f800000;
    local_1a48._0_8_ = 0x7f8000007f800000;
    local_1a48._12_4_ = 0x7f800000;
    while( true ) {
      sVar46 = sVar46 - 1;
      current_00 = current_00 + -1;
      if ((long)sVar46 < 0) break;
      alloc_01.talloc0 = alloc.talloc0;
      alloc_01.alloc = alloc.alloc;
      alloc_01.talloc1 = alloc.talloc1;
      recurse((NodeRecordMB4D *)&isLeft,this,current_00,alloc_01,false);
      pBVar45[-10] = (BBox1f)isLeft.split;
      auVar23._8_8_ = uStack_18d0;
      auVar23._0_8_ = isLeft.vSplitMask;
      *(undefined1 (*) [16])(pBVar45 + -8) = auVar23;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar45 + -6) = local_18c8;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar45 + -4) = local_18b8;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar45 + -2) = local_18a8;
      pBVar45->lower = (float)local_1898._0_4_;
      pBVar45->upper = local_1898.m128[1];
      local_1a48 = vminps_avx(local_1a48,auVar23);
      local_1a38 = vmaxps_avx(local_1a38,(undefined1  [16])local_18c8);
      local_1a08 = vminps_avx(local_1a08,(undefined1  [16])local_18b8);
      unique0x000f2b00 = vmaxps_avx(stack0xffffffffffffe658,(undefined1  [16])local_18a8);
      pBVar45 = pBVar45 + -0xc;
    }
  }
  local_18f0 = local_18f0 | (ulong)pcVar43;
  uVar44 = (ulong)pcVar43 & 0xfffffffffffffff0;
  if (((uint)local_18f0 & 0xf) == 1) {
    pfVar39 = &values[0].dt.upper;
    auVar68._8_4_ = 0x7f7fffff;
    auVar68._0_8_ = 0x7f7fffff7f7fffff;
    auVar68._12_4_ = 0x7f7fffff;
    auVar72._8_4_ = 0xff7fffff;
    auVar72._0_8_ = 0xff7fffffff7fffff;
    auVar72._12_4_ = 0xff7fffff;
    auVar74._8_4_ = 0x7fffffff;
    auVar74._0_8_ = 0x7fffffff7fffffff;
    auVar74._12_4_ = 0x7fffffff;
    for (sVar46 = 0; children.numChildren != sVar46; sVar46 = sVar46 + 1) {
      *(undefined8 *)(uVar44 + sVar46 * 8) = *(undefined8 *)(pfVar39 + -0x15);
      fVar53 = ((BBox1f *)(pfVar39 + -1))->lower;
      fVar76 = 1.0 / (*pfVar39 - fVar53);
      fVar5 = -fVar53 * fVar76;
      auVar54 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar5)),ZEXT416((uint)(1.0 - fVar5)),0);
      auVar92._0_4_ = pfVar39[-9] * auVar54._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar92._4_4_ = pfVar39[-8] * auVar54._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar92._8_4_ = pfVar39[-7] * auVar54._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar92._12_4_ = pfVar39[-6] * auVar54._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar82._0_4_ = pfVar39[-5] * auVar54._0_4_ + pfVar39[-0xd] * auVar64._0_4_;
      auVar82._4_4_ = pfVar39[-4] * auVar54._4_4_ + pfVar39[-0xc] * auVar64._4_4_;
      auVar82._8_4_ = pfVar39[-3] * auVar54._8_4_ + pfVar39[-0xb] * auVar64._8_4_;
      auVar82._12_4_ = pfVar39[-2] * auVar54._12_4_ + pfVar39[-10] * auVar64._12_4_;
      fVar76 = (1.0 - fVar53) * fVar76;
      auVar54 = vshufps_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar76)),ZEXT416((uint)(1.0 - fVar76)),0);
      auVar84._0_4_ = pfVar39[-9] * auVar54._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar84._4_4_ = pfVar39[-8] * auVar54._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar84._8_4_ = pfVar39[-7] * auVar54._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar84._12_4_ = pfVar39[-6] * auVar54._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar77._0_4_ = pfVar39[-5] * auVar54._0_4_ + pfVar39[-0xd] * auVar64._0_4_;
      auVar77._4_4_ = pfVar39[-4] * auVar54._4_4_ + pfVar39[-0xc] * auVar64._4_4_;
      auVar77._8_4_ = pfVar39[-3] * auVar54._8_4_ + pfVar39[-0xb] * auVar64._8_4_;
      auVar77._12_4_ = pfVar39[-2] * auVar54._12_4_ + pfVar39[-10] * auVar64._12_4_;
      auVar21 = vminps_avx(auVar92,auVar68);
      auVar64 = vmaxps_avx(auVar82,auVar72);
      auVar63 = vminps_avx(auVar84,auVar68);
      auVar20 = vmaxps_avx(auVar77,auVar72);
      auVar54 = vandps_avx(auVar21,auVar74);
      auVar87._0_4_ = auVar54._0_4_ * 4.7683716e-07;
      auVar87._4_4_ = auVar54._4_4_ * 4.7683716e-07;
      auVar87._8_4_ = auVar54._8_4_ * 4.7683716e-07;
      auVar87._12_4_ = auVar54._12_4_ * 4.7683716e-07;
      auVar21 = vsubps_avx(auVar21,auVar87);
      auVar54 = vandps_avx(auVar64,auVar74);
      auVar83._0_4_ = auVar64._0_4_ + auVar54._0_4_ * 4.7683716e-07;
      auVar83._4_4_ = auVar64._4_4_ + auVar54._4_4_ * 4.7683716e-07;
      auVar83._8_4_ = auVar64._8_4_ + auVar54._8_4_ * 4.7683716e-07;
      auVar83._12_4_ = auVar64._12_4_ + auVar54._12_4_ * 4.7683716e-07;
      auVar54 = vandps_avx(auVar63,auVar74);
      auVar88._0_4_ = auVar54._0_4_ * 4.7683716e-07;
      auVar88._4_4_ = auVar54._4_4_ * 4.7683716e-07;
      auVar88._8_4_ = auVar54._8_4_ * 4.7683716e-07;
      auVar88._12_4_ = auVar54._12_4_ * 4.7683716e-07;
      auVar64 = vsubps_avx(auVar63,auVar88);
      auVar54 = vandps_avx(auVar20,auVar74);
      *(int *)(uVar44 + 0x40 + sVar46 * 4) = auVar21._0_4_;
      uVar7 = vextractps_avx(auVar21,1);
      *(undefined4 *)(uVar44 + 0x80 + sVar46 * 4) = uVar7;
      auVar78._0_4_ = auVar54._0_4_ * 4.7683716e-07 + auVar20._0_4_;
      auVar78._4_4_ = auVar54._4_4_ * 4.7683716e-07 + auVar20._4_4_;
      auVar78._8_4_ = auVar54._8_4_ * 4.7683716e-07 + auVar20._8_4_;
      auVar78._12_4_ = auVar54._12_4_ * 4.7683716e-07 + auVar20._12_4_;
      uVar7 = vextractps_avx(auVar21,2);
      *(undefined4 *)(uVar44 + 0xc0 + sVar46 * 4) = uVar7;
      *(float *)(uVar44 + 0x60 + sVar46 * 4) = auVar83._0_4_;
      uVar7 = vextractps_avx(auVar83,1);
      *(undefined4 *)(uVar44 + 0xa0 + sVar46 * 4) = uVar7;
      auVar54 = vsubps_avx(auVar64,auVar21);
      uVar7 = vextractps_avx(auVar83,2);
      *(undefined4 *)(uVar44 + 0xe0 + sVar46 * 4) = uVar7;
      *(int *)(uVar44 + 0x100 + sVar46 * 4) = auVar54._0_4_;
      uVar7 = vextractps_avx(auVar54,1);
      *(undefined4 *)(uVar44 + 0x140 + sVar46 * 4) = uVar7;
      auVar64 = vsubps_avx(auVar78,auVar83);
      uVar7 = vextractps_avx(auVar54,2);
      *(undefined4 *)(uVar44 + 0x180 + sVar46 * 4) = uVar7;
      *(int *)(uVar44 + 0x120 + sVar46 * 4) = auVar64._0_4_;
      uVar7 = vextractps_avx(auVar64,1);
      *(undefined4 *)(uVar44 + 0x160 + sVar46 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar64,2);
      *(undefined4 *)(uVar44 + 0x1a0 + sVar46 * 4) = uVar7;
      pfVar39 = pfVar39 + 0x18;
    }
  }
  else {
    pfVar39 = &values[0].dt.upper;
    auVar69._8_4_ = 0x7f7fffff;
    auVar69._0_8_ = 0x7f7fffff7f7fffff;
    auVar69._12_4_ = 0x7f7fffff;
    auVar73._8_4_ = 0xff7fffff;
    auVar73._0_8_ = 0xff7fffffff7fffff;
    auVar73._12_4_ = 0xff7fffff;
    auVar75._8_4_ = 0x7fffffff;
    auVar75._0_8_ = 0x7fffffff7fffffff;
    auVar75._12_4_ = 0x7fffffff;
    auVar79._8_4_ = 0x3f800001;
    auVar79._0_8_ = 0x3f8000013f800001;
    auVar79._12_4_ = 0x3f800001;
    for (sVar46 = 0; children.numChildren != sVar46; sVar46 = sVar46 + 1) {
      *(undefined8 *)(uVar44 + sVar46 * 8) = *(undefined8 *)(pfVar39 + -0x15);
      fVar53 = ((BBox1f *)(pfVar39 + -1))->lower;
      fVar76 = 1.0 / (*pfVar39 - fVar53);
      fVar5 = -fVar53 * fVar76;
      auVar54 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar5)),ZEXT416((uint)(1.0 - fVar5)),0);
      auVar93._0_4_ = pfVar39[-9] * auVar54._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar93._4_4_ = pfVar39[-8] * auVar54._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar93._8_4_ = pfVar39[-7] * auVar54._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar93._12_4_ = pfVar39[-6] * auVar54._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar85._0_4_ = pfVar39[-5] * auVar54._0_4_ + pfVar39[-0xd] * auVar64._0_4_;
      auVar85._4_4_ = pfVar39[-4] * auVar54._4_4_ + pfVar39[-0xc] * auVar64._4_4_;
      auVar85._8_4_ = pfVar39[-3] * auVar54._8_4_ + pfVar39[-0xb] * auVar64._8_4_;
      auVar85._12_4_ = pfVar39[-2] * auVar54._12_4_ + pfVar39[-10] * auVar64._12_4_;
      fVar76 = (1.0 - fVar53) * fVar76;
      auVar54 = vshufps_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),0);
      auVar64 = vshufps_avx(ZEXT416((uint)(1.0 - fVar76)),ZEXT416((uint)(1.0 - fVar76)),0);
      auVar89._0_4_ = pfVar39[-9] * auVar54._0_4_ + pfVar39[-0x11] * auVar64._0_4_;
      auVar89._4_4_ = pfVar39[-8] * auVar54._4_4_ + pfVar39[-0x10] * auVar64._4_4_;
      auVar89._8_4_ = pfVar39[-7] * auVar54._8_4_ + pfVar39[-0xf] * auVar64._8_4_;
      auVar89._12_4_ = pfVar39[-6] * auVar54._12_4_ + pfVar39[-0xe] * auVar64._12_4_;
      auVar80._0_4_ = pfVar39[-0xd] * auVar64._0_4_ + pfVar39[-5] * auVar54._0_4_;
      auVar80._4_4_ = pfVar39[-0xc] * auVar64._4_4_ + pfVar39[-4] * auVar54._4_4_;
      auVar80._8_4_ = pfVar39[-0xb] * auVar64._8_4_ + pfVar39[-3] * auVar54._8_4_;
      auVar80._12_4_ = pfVar39[-10] * auVar64._12_4_ + pfVar39[-2] * auVar54._12_4_;
      auVar21 = vminps_avx(auVar93,auVar69);
      auVar64 = vmaxps_avx(auVar85,auVar73);
      auVar63 = vminps_avx(auVar89,auVar69);
      auVar20 = vmaxps_avx(auVar80,auVar73);
      auVar54 = vandps_avx(auVar21,auVar75);
      auVar90._0_4_ = auVar54._0_4_ * 4.7683716e-07;
      auVar90._4_4_ = auVar54._4_4_ * 4.7683716e-07;
      auVar90._8_4_ = auVar54._8_4_ * 4.7683716e-07;
      auVar90._12_4_ = auVar54._12_4_ * 4.7683716e-07;
      auVar21 = vsubps_avx(auVar21,auVar90);
      auVar54 = vandps_avx(auVar64,auVar75);
      auVar86._0_4_ = auVar64._0_4_ + auVar54._0_4_ * 4.7683716e-07;
      auVar86._4_4_ = auVar64._4_4_ + auVar54._4_4_ * 4.7683716e-07;
      auVar86._8_4_ = auVar64._8_4_ + auVar54._8_4_ * 4.7683716e-07;
      auVar86._12_4_ = auVar64._12_4_ + auVar54._12_4_ * 4.7683716e-07;
      auVar54 = vandps_avx(auVar63,auVar75);
      auVar91._0_4_ = auVar54._0_4_ * 4.7683716e-07;
      auVar91._4_4_ = auVar54._4_4_ * 4.7683716e-07;
      auVar91._8_4_ = auVar54._8_4_ * 4.7683716e-07;
      auVar91._12_4_ = auVar54._12_4_ * 4.7683716e-07;
      auVar64 = vsubps_avx(auVar63,auVar91);
      auVar54 = vandps_avx(auVar20,auVar75);
      *(int *)(uVar44 + 0x40 + sVar46 * 4) = auVar21._0_4_;
      uVar7 = vextractps_avx(auVar21,1);
      *(undefined4 *)(uVar44 + 0x80 + sVar46 * 4) = uVar7;
      auVar81._0_4_ = auVar54._0_4_ * 4.7683716e-07 + auVar20._0_4_;
      auVar81._4_4_ = auVar54._4_4_ * 4.7683716e-07 + auVar20._4_4_;
      auVar81._8_4_ = auVar54._8_4_ * 4.7683716e-07 + auVar20._8_4_;
      auVar81._12_4_ = auVar54._12_4_ * 4.7683716e-07 + auVar20._12_4_;
      uVar7 = vextractps_avx(auVar21,2);
      *(undefined4 *)(uVar44 + 0xc0 + sVar46 * 4) = uVar7;
      *(float *)(uVar44 + 0x60 + sVar46 * 4) = auVar86._0_4_;
      uVar7 = vextractps_avx(auVar86,1);
      *(undefined4 *)(uVar44 + 0xa0 + sVar46 * 4) = uVar7;
      auVar54 = vsubps_avx(auVar64,auVar21);
      uVar7 = vextractps_avx(auVar86,2);
      *(undefined4 *)(uVar44 + 0xe0 + sVar46 * 4) = uVar7;
      *(int *)(uVar44 + 0x100 + sVar46 * 4) = auVar54._0_4_;
      uVar7 = vextractps_avx(auVar54,1);
      *(undefined4 *)(uVar44 + 0x140 + sVar46 * 4) = uVar7;
      auVar64 = vsubps_avx(auVar81,auVar86);
      uVar7 = vextractps_avx(auVar54,2);
      *(undefined4 *)(uVar44 + 0x180 + sVar46 * 4) = uVar7;
      *(int *)(uVar44 + 0x120 + sVar46 * 4) = auVar64._0_4_;
      uVar7 = vextractps_avx(auVar64,1);
      *(undefined4 *)(uVar44 + 0x160 + sVar46 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar64,2);
      *(undefined4 *)(uVar44 + 0x1a0 + sVar46 * 4) = uVar7;
      *(float *)(uVar44 + 0x1c0 + sVar46 * 4) = ((BBox1f *)(pfVar39 + -1))->lower;
      auVar54 = vcmpss_avx(ZEXT416((uint)*pfVar39),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar54 = vblendvps_avx(ZEXT416((uint)*pfVar39),auVar79,auVar54);
      *(int *)(uVar44 + 0x1e0 + sVar46 * 4) = auVar54._0_4_;
      pfVar39 = pfVar39 + 0x18;
    }
  }
  if ((bVar36 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = local_18f0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1a48._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1a48._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1a38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1a38._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1a08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1a08._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_19b0._8_8_;
    *(undefined1 (*) [8])((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         auStack_19a0;
    BVar32 = (current->prims).super_PrimInfoMB.time_range;
  }
  else {
    vSplitPos_1.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos_1.field_0.v[0] = (longlong)set;
    pSVar15 = (Split *)(current->prims).super_PrimInfoMB.object_range._begin;
    pPVar16 = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)
              (current->prims).super_PrimInfoMB.object_range._end;
    vSplitPos.field_0.i[2] = 0x7f800000;
    vSplitPos.field_0.v[0] = 0x7f8000007f800000;
    vSplitPos.field_0.i[3] = 0x7f800000;
    local_1748._0_8_ = 0xff800000ff800000;
    local_1748.m128[2] = -INFINITY;
    local_1748.m128[3] = -INFINITY;
    local_1738.m128[0] = INFINITY;
    local_1738.m128[1] = INFINITY;
    local_1738.m128[2] = INFINITY;
    local_1738.m128[3] = INFINITY;
    local_1728[0].m128[0] = -INFINITY;
    local_1728[0].m128[1] = -INFINITY;
    local_1728[0].m128[2] = -INFINITY;
    local_1728[0].m128[3] = -INFINITY;
    if ((ulong)((long)pPVar16 - (long)pSVar15) < 0xc00) {
      isLeft.split = pSVar15;
      isLeft.vSplitPos = (vint *)pPVar16;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&vSplitMask,(anon_class_16_2_aeee9775 *)&vSplitPos_1,
                 (range<unsigned_long> *)&isLeft);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
      _reduction2 = &time_range0;
      _reduction = (code *)pPVar16;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&vSplitMask,(d1 *)&reduction,
                 (blocked_range<unsigned_long> *)&vSplitPos,(LBBox<embree::Vec3fa> *)&reduction2,
                 (anon_class_16_2_ed117de8_conflict31 *)_reduction2,
                 (anon_class_1_0_00000001 *)&isLeft,in_stack_ffffffffffffe598);
      cVar29 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
      if (cVar29 != '\0') {
        prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar35,"task cancelled");
        __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
    }
    (__return_storage_ptr__->ref).ptr = local_18f0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         vSplitMask.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         vSplitMask.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1988._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1988._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1978._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1978._12_4_,local_1978._8_4_);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 =
         CONCAT44(local_1968[0].m128[1],local_1968[0].m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         CONCAT44(local_1968[0].m128[3],local_1968[0].m128[2]);
    BVar32 = (current->prims).super_PrimInfoMB.time_range;
  }
  __return_storage_ptr__->dt = BVar32;
  for (uVar44 = 0; uVar44 < children.numChildren; uVar44 = uVar44 + 1) {
    pSVar12 = children.primvecs.items[uVar44];
    psVar1 = &pSVar12->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar37 = pSVar12->prims;
      if (pvVar37 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar46 = pvVar37->size_alloced;
        pPVar10 = pvVar37->items;
        if (pPVar10 != (PrimRefMB *)0x0) {
          if (sVar46 * 0x50 < 0x1c00000) {
            alignedFree(pPVar10);
          }
          else {
            os_free(pPVar10,sVar46 * 0x50,(pvVar37->alloc).hugepages);
          }
        }
        if (sVar46 != 0) {
          pMVar11 = (pvVar37->alloc).device;
          (**pMVar11->_vptr_MemoryMonitorInterface)(pMVar11,sVar46 * -0x50,1);
        }
        pvVar37->size_active = 0;
        pvVar37->size_alloced = 0;
        pvVar37->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar37);
    }
  }
  std::
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  ::~unique_ptr(&new_vector);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D recurse(const BuildRecord& current, Allocator alloc, bool toplevel)
          {
            /* get thread local allocator */
            if (!alloc)
              alloc = createAlloc();

            /* call memory monitor function to signal progress */
            if (toplevel && current.size() <= cfg.singleThreadThreshold)
              progressMonitor(current.size());

            /*! find best split */
            const Split csplit = find(current.prims);

            /*! compute leaf and split cost */
            const float leafSAH  = cfg.intCost*current.prims.leafSAH(cfg.logBlockSize);
            const float splitSAH = cfg.travCost*current.prims.halfArea()+cfg.intCost*csplit.splitSAH();
            assert((current.size() == 0) || ((leafSAH >= 0) && (splitSAH >= 0)));

            /*! create a leaf node when threshold reached or SAH tells us to stop */
            if (current.size() <= cfg.minLeafSize || current.depth+MIN_LARGE_LEAF_LEVELS >= cfg.maxDepth || (current.size() <= cfg.maxLeafSize && leafSAH <= splitSAH)) {
              current.prims.deterministic_order();
              return createLargeLeaf(current,alloc);
            }

            /*! perform initial split */
            SetMB lprims,rprims;
            std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,current.prims,lprims,rprims);
            bool hasTimeSplits = new_vector != nullptr;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildList children(current);
            {
              BuildRecord lrecord(lprims,current.depth+1);
              BuildRecord rrecord(rprims,current.depth+1);
              children.split(0,lrecord,rrecord,std::move(new_vector));
            }

            /*! split until node is full or SAH tells us to stop */
            while (children.size() < cfg.branchingFactor) 
            {
              /*! find best child to split */
              float bestArea = neg_inf;
              ssize_t bestChild = -1;
              for (size_t i=0; i<children.size(); i++)
              {
                if (children[i].size() <= cfg.minLeafSize) continue;
                if (expectedApproxHalfArea(children[i].prims.geomBounds) > bestArea) {
                  bestChild = i; bestArea = expectedApproxHalfArea(children[i].prims.geomBounds);
                }
              }
              if (bestChild == -1) break;

              /* perform split */
              BuildRecord& brecord = children[bestChild];
              BuildRecord lrecord(current.depth+1);
              BuildRecord rrecord(current.depth+1);
              Split csplit = find(brecord.prims);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(csplit,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));
            }

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = current.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* sort buildrecords for simpler shadow ray traversal */
            //std::sort(&children[0],&children[children.size()],std::greater<BuildRecord>()); // FIXME: reduces traversal performance of bvh8.triangle4 (need to verified) !!

            /*! create an inner node */
            auto node = createNode(children.children.data(), children.numChildren, alloc, hasTimeSplits);
            LBBox3fa gbounds = empty;

            /* spawn tasks */
            if (unlikely(current.size() > cfg.singleThreadThreshold))
            {
              /*! parallel_for is faster than spawning sub-tasks */
              parallel_for(size_t(0), children.size(), [&] (const range<size_t>& r) {
                  for (size_t i=r.begin(); i<r.end(); i++) {
                    values[i] = recurse(children[i],nullptr,true);
                    _mm_mfence(); // to allow non-temporal stores during build
                  }
                });

              /*! merge bounding boxes */
              for (size_t i=0; i<children.size(); i++)
                gbounds.extend(values[i].lbounds);
            }
            /* recurse into each child */
            else
            {
              //for (size_t i=0; i<children.size(); i++)
              for (ssize_t i=children.size()-1; i>=0; i--) {
                values[i] = recurse(children[i],alloc,false);
                gbounds.extend(values[i].lbounds);
              }
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (unlikely(hasTimeSplits))
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }